

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_huffman.cpp
# Opt level: O0

void build_code(HuffmanTree *huffmanTree,node n,int len,unsigned_long out1,unsigned_long out2)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  long in_RCX;
  int in_EDX;
  HuffmanTree *in_RSI;
  long in_RDI;
  unsigned_long in_R8;
  int index;
  uint in_stack_ffffffffffffffd0;
  int len_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*(char *)&in_RSI->qq == '\0') {
    iVar2 = in_EDX >> 6;
    if (iVar2 == 0) {
      len_00 = (int)((ulong)(in_RCX << 1) >> 0x20);
      build_code(in_RSI,(node)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),len_00,in_R8,
                 (ulong)in_stack_ffffffffffffffd0);
      build_code(in_RSI,(node)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),len_00,in_R8,
                 CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    }
    else {
      if (in_EDX % 0x40 != 0) {
        in_R8 = in_R8 << 1;
      }
      build_code(in_RSI,(node)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                 (int)((ulong)in_RCX >> 0x20),in_R8,CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      build_code(in_RSI,(node)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                 (int)((ulong)in_RCX >> 0x20),in_R8 | 1,CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    }
  }
  else {
    pvVar3 = malloc(0x10);
    *(void **)(*(long *)(in_RDI + 0x28) + (ulong)*(uint *)((long)&in_RSI->qq + 4) * 8) = pvVar3;
    cVar1 = (char)in_EDX;
    if (in_EDX < 0x41) {
      **(long **)(*(long *)(in_RDI + 0x28) + (ulong)*(uint *)((long)&in_RSI->qq + 4) * 8) =
           in_RCX << (0x40U - cVar1 & 0x3f);
      *(unsigned_long *)
       (*(long *)(*(long *)(in_RDI + 0x28) + (ulong)*(uint *)((long)&in_RSI->qq + 4) * 8) + 8) =
           in_R8;
    }
    else {
      **(long **)(*(long *)(in_RDI + 0x28) + (ulong)*(uint *)((long)&in_RSI->qq + 4) * 8) = in_RCX;
      *(unsigned_long *)
       (*(long *)(*(long *)(in_RDI + 0x28) + (ulong)*(uint *)((long)&in_RSI->qq + 4) * 8) + 8) =
           in_R8 << (0x80U - cVar1 & 0x3f);
    }
    *(char *)(*(long *)(in_RDI + 0x30) + (ulong)*(uint *)((long)&in_RSI->qq + 4)) = cVar1;
  }
  return;
}

Assistant:

void build_code(HuffmanTree *huffmanTree, node n, int len, unsigned long out1, unsigned long out2)
{
	if (n->t) {
		huffmanTree->code[n->c] = (unsigned long*)malloc(2*sizeof(unsigned long));
		if(len<=64)
		{
			(huffmanTree->code[n->c])[0] = out1 << (64 - len);
			(huffmanTree->code[n->c])[1] = out2;
		}
		else
		{
			(huffmanTree->code[n->c])[0] = out1;
			(huffmanTree->code[n->c])[1] = out2 << (128 - len);
		}
		huffmanTree->cout[n->c] = (unsigned char)len;
		return;
	}
	int index = len >> 6; //=len/64
	if(index == 0)
	{
		out1 = out1 << 1;
		out1 = out1 | 0;
		build_code(huffmanTree, n->left, len + 1, out1, 0);
		out1 = out1 | 1;
		build_code(huffmanTree, n->right, len + 1, out1, 0);		
	}
	else
	{
		if(len%64!=0)
			out2 = out2 << 1;
		out2 = out2 | 0;
		build_code(huffmanTree, n->left, len + 1, out1, out2);
		out2 = out2 | 1;
		build_code(huffmanTree, n->right, len + 1, out1, out2);	
	}
}